

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

void __thiscall
QFileSystemModelPrivate::removeVisibleFile
          (QFileSystemModelPrivate *this,QFileSystemNode *parentNode,int vLocation)

{
  int iVar1;
  QModelIndex *pQVar2;
  Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *pNVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (vLocation != -1) {
    pQVar2 = *(QModelIndex **)&this->field_0x8;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    index((QFileSystemModelPrivate *)local_48,(char *)this,(int)parentNode);
    if ((&this->root == parentNode) ||
       (((-1 < (int)local_48._0_4_ && (-1 < (long)local_48._0_8_)) &&
        (local_38 != (undefined1 *)0x0)))) {
      iVar4 = vLocation;
      if (this->sortOrder != AscendingOrder) {
        iVar1 = parentNode->dirtyChildrenIndex;
        if (iVar1 == -1) {
          iVar4 = ~vLocation + (int)(parentNode->visibleChildren).d.size;
        }
        else if (vLocation < iVar1) {
          iVar4 = iVar1 + ~vLocation;
        }
      }
      QAbstractItemModel::beginRemoveRows(pQVar2,(int)local_48,iVar4);
      pNVar3 = QHashPrivate::
               Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::
               findNode<QString>((parentNode->children).d,
                                 (parentNode->visibleChildren).d.ptr + vLocation);
      pNVar3->value->isVisible = false;
      QList<QString>::removeAt(&parentNode->visibleChildren,(long)vLocation);
      QAbstractItemModel::endRemoveRows();
    }
    else {
      pNVar3 = QHashPrivate::
               Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::
               findNode<QString>((parentNode->children).d,
                                 (parentNode->visibleChildren).d.ptr + vLocation);
      pNVar3->value->isVisible = false;
      QList<QString>::removeAt(&parentNode->visibleChildren,(long)vLocation);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::removeVisibleFile(QFileSystemNode *parentNode, int vLocation)
{
    Q_Q(QFileSystemModel);
    if (vLocation == -1)
        return;
    QModelIndex parent = index(parentNode);
    bool indexHidden = isHiddenByFilter(parentNode, parent);
    if (!indexHidden)
        q->beginRemoveRows(parent, translateVisibleLocation(parentNode, vLocation),
                                       translateVisibleLocation(parentNode, vLocation));
    parentNode->children.value(parentNode->visibleChildren.at(vLocation))->isVisible = false;
    parentNode->visibleChildren.removeAt(vLocation);
    if (!indexHidden)
        q->endRemoveRows();
}